

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O2

bool tchecker::zg::shared_is_alu_le(state_t *s1,state_t *s2,map_t *l,map_t *u)

{
  bool bVar1;
  zone_t *this;
  zone_t *zone;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_> local_30;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_> local_28;
  
  bVar1 = ta::shared_equal_to(&s1->super_state_t,&s2->super_state_t);
  if (bVar1) {
    state_t::zone_ptr((state_t *)&local_28);
    state_t::zone_ptr((state_t *)&local_30);
    if (local_28._t == (make_shared_t<tchecker::intval_t,_unsigned_long,_1UL> *)local_30._t) {
      bVar1 = true;
    }
    else {
      this = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
              ::operator*(&s1->_zone)->super_zone_t;
      zone = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
              ::operator*(&s2->_zone)->super_zone_t;
      bVar1 = zone_t::is_alu_le(this,zone,l,u);
    }
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
                *)&local_30);
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
                *)&local_28);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool shared_is_alu_le(tchecker::zg::state_t const & s1, tchecker::zg::state_t const & s2,
                      tchecker::clockbounds::map_t const & l, tchecker::clockbounds::map_t const & u)
{
  return tchecker::ta::shared_equal_to(s1, s2) && (s1.zone_ptr() == s2.zone_ptr() || s1.zone().is_alu_le(s2.zone(), l, u));
}